

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O0

PhysicalDeviceSelector * __thiscall
vkb::PhysicalDeviceSelector::add_required_extensions
          (PhysicalDeviceSelector *this,
          vector<const_char_*,_std::allocator<const_char_*>_> *extensions)

{
  char *__s;
  bool bVar1;
  allocator<char> local_59;
  value_type local_58;
  reference local_38;
  char **ext;
  const_iterator __end1;
  const_iterator __begin1;
  vector<const_char_*,_std::allocator<const_char_*>_> *__range1;
  vector<const_char_*,_std::allocator<const_char_*>_> *extensions_local;
  PhysicalDeviceSelector *this_local;
  
  __end1 = std::vector<const_char_*,_std::allocator<const_char_*>_>::begin(extensions);
  ext = (char **)std::vector<const_char_*,_std::allocator<const_char_*>_>::end(extensions);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                                *)&ext);
    if (!bVar1) break;
    local_38 = __gnu_cxx::
               __normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
               ::operator*(&__end1);
    __s = *local_38;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,__s,&local_59);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&(this->criteria).required_extensions,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator(&local_59);
    __gnu_cxx::
    __normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
    ::operator++(&__end1);
  }
  return this;
}

Assistant:

PhysicalDeviceSelector& PhysicalDeviceSelector::add_required_extensions(std::vector<const char*> const& extensions) {
    for (const auto& ext : extensions) {
        criteria.required_extensions.push_back(ext);
    }
    return *this;
}